

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

array * cs::parse_cmd_args(array *__return_storage_ptr__,int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  array arg;
  any aStack_88;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_80;
  
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base(&local_80);
  lVar1 = (long)argc;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    cs_impl::any::make_constant<std::__cxx11::string,char*&>(&aStack_88,argv);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_80,&aStack_88);
    cs_impl::any::recycle(&aStack_88);
    argv = argv + 1;
  }
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
            (&__return_storage_ptr__->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>
             ,&local_80);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

array parse_cmd_args(int argc, char *argv[])
	{
		cs::array arg;
		for (std::size_t i = 0; i < argc; ++i)
			arg.emplace_back(cs::var::make_constant<cs::string>(argv[i]));
		return std::move(arg);
	}